

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O1

Var Js::JavascriptMap::EntrySet(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var aValue;
  JavascriptMap *this;
  RecyclableObject *key;
  RecyclableObject *value;
  uint64 uVar5;
  uint64 uVar6;
  int in_stack_00000010;
  undefined1 local_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0xed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce368b;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_48,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (JavascriptMap *)0x0;
  aValue = Arguments::operator[]((Arguments *)local_48,0);
  bVar3 = VarIs<Js::JavascriptMap>(aValue);
  if (bVar3) {
    this = UnsafeVarTo<Js::JavascriptMap>(aValue);
  }
  if (this == (JavascriptMap *)0x0) {
    JavascriptError::ThrowTypeErrorVar(pSVar1,-0x7ff5ec04,L"Map.prototype.set",L"Map");
  }
  if (((ulong)local_48 & 0xfffffe) == 0) {
    key = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
          undefinedValue.ptr;
  }
  else {
    key = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,1);
  }
  if ((local_48._0_4_ & 0xffffff) < 3) {
    value = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
            undefinedValue.ptr;
  }
  else {
    value = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,2);
  }
  if ((ulong)key >> 0x32 != 0) {
    bVar3 = NumberUtilities::IsSpecial((double)((ulong)key ^ 0xfffc000000000000),0x8000000000000000)
    ;
    if (bVar3) {
      uVar5 = NumberUtilities::ToSpecial(0.0);
      bVar3 = NumberUtilities::IsNan(0.0);
      if (bVar3) {
        uVar6 = NumberUtilities::ToSpecial(0.0);
        if (uVar6 != 0xfff8000000000000) {
          uVar6 = NumberUtilities::ToSpecial(0.0);
          if (uVar6 != 0x7ff8000000000000) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar4 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar3) {
LAB_00ce368b:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar4 = 0;
          }
        }
      }
      key = (RecyclableObject *)(uVar5 ^ 0xfffc000000000000);
    }
  }
  Set(this,key,value);
  return this;
}

Assistant:

Var JavascriptMap::EntrySet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.set"), _u("Map"));
    }

    Var key = (args.Info.Count > 1) ? args[1] : scriptContext->GetLibrary()->GetUndefined();
    Var value = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    if (JavascriptNumber::Is(key) && JavascriptNumber::IsNegZero(JavascriptNumber::GetValue(key)))
    {
        // Normalize -0 to +0
        key = JavascriptNumber::New(0.0, scriptContext);
    }

    map->Set(key, value);

    return map;
}